

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O0

void sha256_final(ptls_hash_context_t *_ctx,void *md,ptls_hash_final_mode_t mode)

{
  undefined1 local_98 [8];
  cf_sha256_context copy;
  sha256_context_t *ctx;
  ptls_hash_final_mode_t mode_local;
  void *md_local;
  ptls_hash_context_t *_ctx_local;
  
  copy.npartial = (size_t)_ctx;
  if (mode == PTLS_HASH_FINAL_MODE_SNAPSHOT) {
    memcpy(local_98,_ctx + 1,0x70);
    cf_sha256_digest_final((cf_sha256_context *)local_98,(uint8_t *)md);
    (*ptls_clear_memory)(local_98,0x70);
  }
  else {
    if (md != (void *)0x0) {
      cf_sha256_digest_final((cf_sha256_context *)(_ctx + 1),(uint8_t *)md);
    }
    if (mode == PTLS_HASH_FINAL_MODE_FREE) {
      (*ptls_clear_memory)((void *)(copy.npartial + 0x10),0x70);
      free((void *)copy.npartial);
    }
    else {
      if (mode != PTLS_HASH_FINAL_MODE_RESET) {
        __assert_fail("!\"FIXME\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/cifra.c"
                      ,0x113,
                      "void sha256_final(ptls_hash_context_t *, void *, ptls_hash_final_mode_t)");
      }
      cf_sha256_init((cf_sha256_context *)(copy.npartial + 0x10));
    }
  }
  return;
}

Assistant:

static void sha256_final(ptls_hash_context_t *_ctx, void *md, ptls_hash_final_mode_t mode)
{
    struct sha256_context_t *ctx = (struct sha256_context_t *)_ctx;

    if (mode == PTLS_HASH_FINAL_MODE_SNAPSHOT) {
        cf_sha256_context copy = ctx->ctx;
        cf_sha256_digest_final(&copy, md);
        ptls_clear_memory(&copy, sizeof(copy));
        return;
    }

    if (md != NULL)
        cf_sha256_digest_final(&ctx->ctx, md);

    switch (mode) {
    case PTLS_HASH_FINAL_MODE_FREE:
        ptls_clear_memory(&ctx->ctx, sizeof(ctx->ctx));
        free(ctx);
        break;
    case PTLS_HASH_FINAL_MODE_RESET:
        cf_sha256_init(&ctx->ctx);
        break;
    default:
        assert(!"FIXME");
        break;
    }
}